

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ontrak.cpp
# Opt level: O3

void CleanUp_ontrak(BOOL bSetDefaultDevicesState)

{
  int iVar1;
  timespec local_18;
  
  if (bSetDefaultDevicesState != 0) {
    SetDigitalRelayOntrak(&ontrak,7,0);
    SetDigitalRelayOntrak(&ontrak,6,0);
    SetRelayOntrak(&ontrak,3,1);
    SetRelayOntrak(&ontrak,4,0);
    SetRelayOntrak(&ontrak,2,1);
    SetRelayOntrak(&ontrak,1,1);
    SetRelayOntrak(&ontrak,0,1);
  }
  fclose((FILE *)logpowerfile_ontrak);
  if (chrono_power.Suspended == 0) {
    iVar1 = clock_gettime(4,&local_18);
    if (iVar1 != 0) {
      return;
    }
    chrono_power.Finish.tv_nsec = local_18.tv_nsec;
    chrono_power.Finish.tv_sec = local_18.tv_sec;
    local_18.tv_sec =
         ((local_18.tv_sec + chrono_power.Duration.tv_sec) - chrono_power.Start.tv_sec) +
         (local_18.tv_nsec + chrono_power.Duration.tv_nsec) / 1000000000;
    local_18.tv_nsec =
         (local_18.tv_nsec + chrono_power.Duration.tv_nsec) % 1000000000 -
         chrono_power.Start.tv_nsec;
    if (local_18.tv_nsec < 0) {
      local_18.tv_sec = local_18.tv_sec + ~((ulong)-local_18.tv_nsec / 1000000000);
      local_18.tv_nsec =
           local_18.tv_nsec + 1000000000 + ((ulong)-local_18.tv_nsec / 1000000000) * 1000000000;
    }
    chrono_power.Duration.tv_nsec = local_18.tv_nsec;
    chrono_power.Duration.tv_sec = local_18.tv_sec;
  }
  t_ontrak = (double)chrono_power.Duration.tv_nsec / 1000000000.0 +
             (double)chrono_power.Duration.tv_sec;
  return;
}

Assistant:

void CleanUp_ontrak(BOOL bSetDefaultDevicesState)
{
	if (bSetDefaultDevicesState)
	{
		SetDigitalRelayOntrak(&ontrak, SAIL_MOTOR_CHANNEL_ONTRAK, 0);
		SetDigitalRelayOntrak(&ontrak, IRIDIUM_CHANNEL_ONTRAK, 0);
		SetRelayOntrak(&ontrak, WIFI_CHANNEL_ONTRAK, 1); // Active-low.
		SetRelayOntrak(&ontrak, PROBE_CHANNEL_ONTRAK, 0);
		SetRelayOntrak(&ontrak, SURFACE_PUMP_CHANNEL_ONTRAK, 1);
		SetRelayOntrak(&ontrak, BOTTOM_PUMP_CHANNEL_ONTRAK, 1);
		SetRelayOntrak(&ontrak, ARMADEUS_CHANNEL_ONTRAK, 1); // Active-low.
	}
	fclose(logpowerfile_ontrak);
	StopChrono(&chrono_power, &t_ontrak);
}